

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  AlphaNum *x2;
  size_t sVar1;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  ulong in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  AlphaNum *x1;
  char *out_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  reference local_100;
  AlphaNum *local_f8;
  AlphaNum *local_20;
  AlphaNum *local_18;
  AlphaNum *local_10;
  ulong local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  x2 = (AlphaNum *)std::__cxx11::string::size();
  local_f8 = x2;
  sVar1 = strings::AlphaNum::size(local_10);
  x1 = (AlphaNum *)(x2->digits + (sVar1 - 0x10));
  sVar1 = strings::AlphaNum::size(local_18);
  out_00 = x1->digits + (sVar1 - 0x10);
  strings::AlphaNum::size(local_20);
  std::__cxx11::string::resize(local_8);
  local_108._M_current = (char *)std::__cxx11::string::begin();
  local_100 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_108);
  Append2(out_00,x1,x2);
  Append1(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  return;
}

Assistant:

void StrAppend(string *result,
               const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}